

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipFieldMessage(ParserImpl *this)

{
  char *pcVar1;
  size_t __n;
  long *plVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  string_view message;
  string delimiter;
  undefined1 local_e0 [48];
  AlphaNum local_b0;
  long *local_80;
  char *local_78;
  long local_70 [4];
  long *local_50;
  char *local_48;
  long local_40 [2];
  
  iVar4 = this->recursion_limit_;
  this->recursion_limit_ = iVar4 + -1;
  if (iVar4 < 1) {
    local_e0._0_8_ = (pointer)0x4b;
    local_e0._8_8_ = "Message is too deep, the parser exceeded the configured recursion limit of ";
    pcVar1 = local_b0.digits_;
    lVar5 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                      (this->initial_recursion_limit_,pcVar1);
    local_b0.piece_._M_len = lVar5 - (long)pcVar1;
    local_80 = (long *)0x1;
    local_78 = ".";
    local_b0.piece_._M_str = pcVar1;
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_50,(AlphaNum *)local_e0,&local_b0);
    message._M_str = (char *)local_50;
    message._M_len = (size_t)local_48;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    bVar3 = false;
  }
  else {
    local_e0._0_8_ = local_e0 + 0x10;
    local_e0._8_8_ = (char *)0x0;
    local_e0[0x10] = '\0';
    bVar3 = ConsumeMessageDelimiter(this,(string *)local_e0);
    if (bVar3) {
      do {
        local_b0.piece_._M_len = (size_t)local_b0.digits_;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,">","");
        pcVar6 = (char *)local_b0.piece_._M_len;
        pcVar1 = (char *)(this->tokenizer_).current_.text._M_string_length;
        if ((pcVar1 == local_b0.piece_._M_str) &&
           ((pcVar1 == (char *)0x0 ||
            (iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,
                          (void *)local_b0.piece_._M_len,(size_t)pcVar1), iVar4 == 0)))) {
          bVar3 = false;
        }
        else {
          local_80 = local_70;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"}","");
          plVar2 = local_80;
          __n = (this->tokenizer_).current_.text._M_string_length;
          if ((char *)__n == local_78) {
            if (__n == 0) {
              bVar3 = false;
            }
            else {
              iVar4 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_80,__n);
              bVar3 = iVar4 != 0;
            }
          }
          else {
            bVar3 = true;
          }
          pcVar6 = (char *)local_b0.piece_._M_len;
          if (plVar2 != local_70) {
            operator_delete(plVar2,local_70[0] + 1);
            pcVar6 = (char *)local_b0.piece_._M_len;
          }
        }
        if (pcVar6 != local_b0.digits_) {
          operator_delete(pcVar6,local_b0.digits_._0_8_ + 1);
        }
        if (!bVar3) {
          bVar3 = Consume(this,(string *)local_e0);
          if (bVar3) {
            this->recursion_limit_ = this->recursion_limit_ + 1;
            bVar3 = true;
            goto LAB_002fe939;
          }
          break;
        }
        bVar3 = SkipField(this);
      } while (bVar3);
    }
    bVar3 = false;
LAB_002fe939:
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_,CONCAT71(local_e0._17_7_,local_e0[0x10]) + 1);
    }
  }
  return bVar3;
}

Assistant:

bool SkipFieldMessage() {
    if (--recursion_limit_ < 0) {
      ReportError(
          absl::StrCat("Message is too deep, the parser exceeded the "
                       "configured recursion limit of ",
                       initial_recursion_limit_, "."));
      return false;
    }

    std::string delimiter;
    DO(ConsumeMessageDelimiter(&delimiter));
    while (!LookingAt(">") && !LookingAt("}")) {
      DO(SkipField());
    }
    DO(Consume(delimiter));

    ++recursion_limit_;
    return true;
  }